

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

void thread_proc(void)

{
  IBackend *pIVar1;
  pointer pcVar2;
  pointer puVar3;
  log_entry *plVar4;
  unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_> *backend;
  pointer puVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  
  while (cancel == false) {
    plVar4 = log_queue::pop_top(queue);
    puVar3 = backends.
             super__Vector_base<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (plVar4 != (log_entry *)0x0) {
      if (backends.
          super__Vector_base<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          backends.
          super__Vector_base<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        puVar5 = backends.
                 super__Vector_base<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          if ((ulong)plVar4->level < 4) {
            pIVar1 = (puVar5->_M_t).
                     super___uniq_ptr_impl<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_f8n::debug::IBackend_*,_std::default_delete<f8n::debug::IBackend>_>
                     .super__Head_base<0UL,_f8n::debug::IBackend_*,_false>._M_head_impl;
            (**(code **)((long)pIVar1->_vptr_IBackend +
                        *(long *)(&DAT_001e9ff8 + (ulong)plVar4->level * 8)))
                      (pIVar1,&plVar4->tag,&plVar4->message);
          }
          puVar5 = puVar5 + 1;
        } while (puVar5 != puVar3);
      }
      pcVar2 = (plVar4->message)._M_dataplus._M_p;
      paVar6 = &(plVar4->message).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar6) {
        operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
      }
      pcVar2 = (plVar4->tag)._M_dataplus._M_p;
      paVar6 = &(plVar4->tag).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar6) {
        operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
      }
      operator_delete(plVar4,0x48);
    }
  }
  return;
}

Assistant:

static void thread_proc() {
    try {
        while (!cancel) {
            log_queue::log_entry* entry = queue->pop_top();
            if (entry) {
                for (auto& backend : backends) {
                    switch (entry->level) {
                        case debug_level::verbose:
                            backend->verbose(entry->tag, entry->message);
                            break;
                        case debug_level::info:
                            backend->info(entry->tag, entry->message);
                            break;
                        case debug_level::warning:
                            backend->warning(entry->tag, entry->message);
                            break;
                        case debug_level::error:
                            backend->verbose(entry->tag, entry->message);
                            break;
                    }
                }
                delete entry;
            }
        }
    }
    catch (log_queue::stopped_exception&) {
    }
}